

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtextdocumentfragment.cpp
# Opt level: O0

int __thiscall QTextCopyHelper::copy(QTextCopyHelper *this,EVP_PKEY_CTX *dst,EVP_PKEY_CTX *src)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  QTextFormat *oldFormat;
  long in_FS_OFFSET;
  int end;
  int cellPos;
  int blockIdx;
  int charFormatIndex;
  int cc;
  int cr;
  int cspan;
  int rspan;
  int c;
  int r;
  int objectIndex;
  QTextTable *table;
  int num_cols;
  int num_rows;
  int col_start;
  int row_start;
  QTextBlock block;
  QTextCharFormat cellFormat;
  QTextTableCell cell;
  QTextTableFormat tableFormat;
  int in_stack_ffffffffffffff38;
  int in_stack_ffffffffffffff3c;
  QTextDocumentPrivate *in_stack_ffffffffffffff40;
  int in_stack_ffffffffffffff50;
  int in_stack_ffffffffffffff54;
  int in_stack_ffffffffffffff58;
  int in_stack_ffffffffffffff5c;
  undefined4 in_stack_ffffffffffffff60;
  undefined4 in_stack_ffffffffffffff64;
  int in_stack_ffffffffffffff68;
  int local_8c;
  int local_88;
  QTextCopyHelper *this_00;
  QTextDocumentPrivate *in_stack_ffffffffffffff90;
  int in_stack_ffffffffffffffb4;
  undefined1 *in_stack_ffffffffffffffb8;
  QTextCopyHelper *in_stack_ffffffffffffffc0;
  undefined1 local_28 [16];
  undefined1 *local_18;
  undefined1 *local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = this;
  bVar1 = QTextCursor::hasComplexSelection
                    ((QTextCursor *)CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38));
  if (bVar1) {
    oldFormat = (QTextFormat *)
                QTextCursor::currentTable
                          ((QTextCursor *)
                           CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58));
    QTextCursor::selectedTableCells
              ((QTextCursor *)CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60),
               (int *)CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58),
               (int *)CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50),&this->insertPos
               ,(int *)in_stack_ffffffffffffff40);
    local_18 = &DAT_aaaaaaaaaaaaaaaa;
    local_10 = &DAT_aaaaaaaaaaaaaaaa;
    QTextTable::format((QTextTable *)CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50));
    QTextTableFormat::setColumns
              ((QTextTableFormat *)this,(int)((ulong)in_stack_ffffffffffffff40 >> 0x20));
    QTextTableFormat::clearColumnWidthConstraints((QTextTableFormat *)0x7e8760);
    QTextDocumentPrivate::formatCollection(this->dst);
    iVar5 = QTextFormatCollection::createObjectIndex
                      ((QTextFormatCollection *)
                       CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50),
                       (QTextFormat *)this);
    for (local_88 = -0x55555556; local_88 < 0x55555554; local_88 = local_88 + 1) {
      for (local_8c = -0x55555556; local_8c < 0x55555554; local_8c = local_8c + 1) {
        local_28._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
        local_28._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
        QTextTable::cellAt((QTextTable *)
                           CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58),
                           in_stack_ffffffffffffff54,in_stack_ffffffffffffff50);
        iVar2 = QTextTableCell::rowSpan((QTextTableCell *)this);
        iVar3 = QTextTableCell::columnSpan((QTextTableCell *)this);
        if (((iVar2 == 1) ||
            (in_stack_ffffffffffffff68 = QTextTableCell::row((QTextTableCell *)this),
            in_stack_ffffffffffffff68 == local_88)) &&
           ((iVar3 == 1 ||
            (iVar4 = QTextTableCell::column((QTextTableCell *)this), iVar4 == local_8c)))) {
          QTextTableCell::format((QTextTableCell *)CONCAT44(iVar3,in_stack_ffffffffffffff68));
          if (0x55555553 < local_88 + iVar2) {
            QTextCharFormat::setTableCellRowSpan
                      ((QTextCharFormat *)this,(int)((ulong)in_stack_ffffffffffffff40 >> 0x20));
          }
          if (0x55555553 < local_8c + iVar3) {
            QTextCharFormat::setTableCellColumnSpan
                      ((QTextCharFormat *)this,(int)((ulong)in_stack_ffffffffffffff40 >> 0x20));
          }
          in_stack_ffffffffffffff5c = convertFormatIndex(this_00,oldFormat,iVar5);
          in_stack_ffffffffffffff58 = -2;
          iVar2 = QTextTableCell::firstPosition((QTextTableCell *)in_stack_ffffffffffffff40);
          in_stack_ffffffffffffffb8 = &DAT_aaaaaaaaaaaaaaaa;
          in_stack_ffffffffffffffc0 = (QTextCopyHelper *)&DAT_aaaaaaaaaaaaaaaa;
          QTextDocumentPrivate::blocksFind
                    ((QTextDocumentPrivate *)
                     CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58),iVar2);
          iVar3 = QTextBlock::position
                            ((QTextBlock *)
                             CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38));
          if (iVar3 == iVar2) {
            QTextBlock::blockFormat((QTextBlock *)CONCAT44(iVar2,in_stack_ffffffffffffff50));
            in_stack_ffffffffffffff58 = convertFormatIndex(this_00,oldFormat,iVar5);
            QTextBlockFormat::~QTextBlockFormat((QTextBlockFormat *)0x7e89b7);
          }
          in_stack_ffffffffffffff40 = this->dst;
          QChar::QChar<char16_t,_true>((QChar *)&stack0xffffffffffffff96,L'﷐');
          QTextDocumentPrivate::insertBlock
                    (in_stack_ffffffffffffff90,
                     (QChar)(char16_t)((ulong)in_stack_ffffffffffffffb8 >> 0x30),
                     (int)((ulong)this_00 >> 0x20),(int)this_00,(int)((ulong)oldFormat >> 0x20),
                     (Operation)oldFormat);
          this->insertPos = this->insertPos + 1;
          iVar3 = QTextTableCell::lastPosition
                            ((QTextTableCell *)CONCAT44(iVar2,in_stack_ffffffffffffff50));
          in_stack_ffffffffffffff54 = iVar2;
          if (iVar2 < iVar3) {
            QTextTableCell::lastPosition
                      ((QTextTableCell *)CONCAT44(iVar2,in_stack_ffffffffffffff50));
            appendFragments((QTextCopyHelper *)in_stack_ffffffffffffff40,iVar2,
                            in_stack_ffffffffffffff38);
            in_stack_ffffffffffffff3c = iVar2;
          }
          QTextCharFormat::~QTextCharFormat((QTextCharFormat *)0x7e8a4a);
        }
        QTextTableCell::~QTextTableCell((QTextTableCell *)local_28);
      }
    }
    QTextFrame::lastPosition
              ((QTextFrame *)CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38));
    appendFragment(in_stack_ffffffffffffffc0,(int)((ulong)in_stack_ffffffffffffffb8 >> 0x20),
                   (int)in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb4);
    QTextTableFormat::~QTextTableFormat((QTextTableFormat *)0x7e8ac3);
  }
  else {
    iVar5 = QTextCursor::selectionStart((QTextCursor *)this);
    QTextCursor::selectionEnd((QTextCursor *)this);
    appendFragments((QTextCopyHelper *)in_stack_ffffffffffffff40,in_stack_ffffffffffffff3c,iVar5);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return (int)*(long *)(in_FS_OFFSET + 0x28);
}

Assistant:

void QTextCopyHelper::copy()
{
    if (cursor.hasComplexSelection()) {
        QTextTable *table = cursor.currentTable();
        int row_start, col_start, num_rows, num_cols;
        cursor.selectedTableCells(&row_start, &num_rows, &col_start, &num_cols);

        QTextTableFormat tableFormat = table->format();
        tableFormat.setColumns(num_cols);
        tableFormat.clearColumnWidthConstraints();
        const int objectIndex = dst->formatCollection()->createObjectIndex(tableFormat);

        Q_ASSERT(row_start != -1);
        for (int r = row_start; r < row_start + num_rows; ++r) {
            for (int c = col_start; c < col_start + num_cols; ++c) {
                QTextTableCell cell = table->cellAt(r, c);
                const int rspan = cell.rowSpan();
                const int cspan = cell.columnSpan();
                if (rspan != 1) {
                    int cr = cell.row();
                    if (cr != r)
                        continue;
                }
                if (cspan != 1) {
                    int cc = cell.column();
                    if (cc != c)
                        continue;
                }

                // add the QTextBeginningOfFrame
                QTextCharFormat cellFormat = cell.format();
                if (r + rspan >= row_start + num_rows) {
                    cellFormat.setTableCellRowSpan(row_start + num_rows - r);
                }
                if (c + cspan >= col_start + num_cols) {
                    cellFormat.setTableCellColumnSpan(col_start + num_cols - c);
                }
                const int charFormatIndex = convertFormatIndex(cellFormat, objectIndex);

                int blockIdx = -2;
                const int cellPos = cell.firstPosition();
                QTextBlock block = src->blocksFind(cellPos);
                if (block.position() == cellPos) {
                    blockIdx = convertFormatIndex(block.blockFormat());
                }

                dst->insertBlock(QTextBeginningOfFrame, insertPos, blockIdx, charFormatIndex);
                ++insertPos;

                // nothing to add for empty cells
                if (cell.lastPosition() > cellPos) {
                    // add the contents
                    appendFragments(cellPos, cell.lastPosition());
                }
            }
        }

        // add end of table
        int end = table->lastPosition();
        appendFragment(end, end+1, objectIndex);
    } else {
        appendFragments(cursor.selectionStart(), cursor.selectionEnd());
    }
}